

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_signed_char_&,_const_int_&> * __thiscall
Catch::ExprLhs<signed_char_const&>::operator==
          (BinaryExpr<const_signed_char_&,_const_int_&> *__return_storage_ptr__,
          ExprLhs<signed_char_const&> *this,int *rhs)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  StringRef local_40;
  
  pcVar3 = *(char **)this;
  cVar1 = *pcVar3;
  iVar2 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = iVar2 == cVar1;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0019cad8;
  __return_storage_ptr__->m_lhs = pcVar3;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }